

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_mul(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = a->sign;
  iVar2 = b->sign;
  iVar3 = b->used + a->used + 1;
  if (b->used + a->used < 0x1ff) {
    iVar3 = fast_s_mp_mul_digs(a,b,c,iVar3);
  }
  else {
    iVar3 = s_mp_mul_digs(a,b,c,iVar3);
  }
  c->sign = (uint)(0 < c->used && iVar1 != iVar2);
  return iVar3;
}

Assistant:

int mp_mul (mp_int * a, mp_int * b, mp_int * c)
{
  int     res, neg;
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;

  {
    /* can we use the fast multiplier?
     *
     * The fast multiplier can be used if the output will 
     * have less than MP_WARRAY digits and the number of 
     * digits won't affect carry propagation
     */
    int     digs = a->used + b->used + 1;

    if ((digs < MP_WARRAY) &&
        MIN(a->used, b->used) <= 
        (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
      res = fast_s_mp_mul_digs (a, b, c, digs);
    } else 
      res = s_mp_mul (a, b, c); /* uses s_mp_mul_digs */
  }
  c->sign = (c->used > 0) ? neg : MP_ZPOS;
  return res;
}